

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_index(DisasContext_conflict1 *s,int esz,int rd,TCGv_i64 start,TCGv_i64 incr)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr a;
  uint32_t uVar1;
  int iVar2;
  TCGv_i32 arg4;
  TCGv_ptr r;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 i32;
  TCGv_i32 s32;
  TCGv_ptr t_zd;
  TCGv_i32 desc;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 incr_local;
  TCGv_i64 start_local;
  int rd_local;
  int esz_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = vec_full_reg_size(s);
  uVar1 = simd_desc_aarch64(uVar1,uVar1,0);
  arg4 = tcg_const_i32_aarch64(tcg_ctx_00,uVar1);
  r = tcg_temp_new_ptr(tcg_ctx_00);
  a = tcg_ctx_00->cpu_env;
  iVar2 = vec_full_reg_offset(s,rd);
  tcg_gen_addi_ptr(tcg_ctx_00,r,a,(long)iVar2);
  if (esz == 3) {
    gen_helper_sve_index_d(tcg_ctx_00,r,start,incr,arg4);
  }
  else {
    ret = tcg_temp_new_i32(tcg_ctx_00);
    ret_00 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,ret,start);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,ret_00,incr);
    (*do_index::fns[esz])(tcg_ctx_00,r,ret,ret_00,arg4);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    tcg_temp_free_i32(tcg_ctx_00,ret_00);
  }
  tcg_temp_free_ptr(tcg_ctx_00,r);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  return;
}

Assistant:

static void do_index(DisasContext *s, int esz, int rd,
                     TCGv_i64 start, TCGv_i64 incr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    TCGv_ptr t_zd = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zd, tcg_ctx->cpu_env, vec_full_reg_offset(s, rd));
    if (esz == 3) {
        gen_helper_sve_index_d(tcg_ctx, t_zd, start, incr, desc);
    } else {
        typedef void index_fn(TCGContext *, TCGv_ptr, TCGv_i32, TCGv_i32, TCGv_i32);
        static index_fn * const fns[3] = {
            gen_helper_sve_index_b,
            gen_helper_sve_index_h,
            gen_helper_sve_index_s,
        };
        TCGv_i32 s32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 i32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, s32, start);
        tcg_gen_extrl_i64_i32(tcg_ctx, i32, incr);
        fns[esz](tcg_ctx, t_zd, s32, i32, desc);

        tcg_temp_free_i32(tcg_ctx, s32);
        tcg_temp_free_i32(tcg_ctx, i32);
    }
    tcg_temp_free_ptr(tcg_ctx, t_zd);
    tcg_temp_free_i32(tcg_ctx, desc);
}